

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O1

void __thiscall
Logger::Logger(Logger *this,string *logDir,string *logModuleName,LogLevel logLevel,
              bool outputToTerminal)

{
  _Rb_tree_header *p_Var1;
  
  (this->logDir)._M_dataplus._M_p = (pointer)&(this->logDir).field_2;
  (this->logDir)._M_string_length = 0;
  (this->logDir).field_2._M_local_buf[0] = '\0';
  (this->logModuleName)._M_dataplus._M_p = (pointer)&(this->logModuleName).field_2;
  (this->logModuleName)._M_string_length = 0;
  (this->logModuleName).field_2._M_local_buf[0] = '\0';
  (this->logFileName)._M_dataplus._M_p = (pointer)&(this->logFileName).field_2;
  (this->logFileName)._M_string_length = 0;
  (this->logFileName).field_2._M_local_buf[0] = '\0';
  (this->logCreateDate)._M_dataplus._M_p = (pointer)&(this->logCreateDate).field_2;
  (this->logCreateDate)._M_string_length = 0;
  (this->logCreateDate).field_2._M_local_buf[0] = '\0';
  (this->logConfigFile)._M_dataplus._M_p = (pointer)&(this->logConfigFile).field_2;
  (this->logConfigFile)._M_string_length = 0;
  (this->logConfigFile).field_2._M_local_buf[0] = '\0';
  std::ofstream::ofstream(&this->logfp,(char *)0x0,_S_out);
  memset(&this->configMtx,0,0xa0);
  std::_Deque_base<LogMessage,_std::allocator<LogMessage>_>::_M_initialize_map
            ((_Deque_base<LogMessage,_std::allocator<LogMessage>_> *)&this->logQueue,0);
  (this->logThread)._M_id._M_thread = 0;
  (this->timerThread)._M_id._M_thread = 0;
  std::condition_variable::condition_variable(&this->cv);
  p_Var1 = &(this->log_map)._M_t._M_impl.super__Rb_tree_header;
  (this->log_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->log_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->log_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->log_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->log_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)&this->logDir);
  std::__cxx11::string::_M_assign((string *)&this->logModuleName);
  this->logLevel = logLevel;
  this->outputToTerminal = outputToTerminal;
  std::__cxx11::string::_M_replace
            ((ulong)&this->logConfigFile,0,(char *)(this->logConfigFile)._M_string_length,0x1091df);
  return;
}

Assistant:

Logger(std::string logDir, std::string logModuleName, LogLevel logLevel, bool outputToTerminal) {
        this->logDir = logDir;
        this->logModuleName = logModuleName;
        this->logLevel = logLevel;
        this->outputToTerminal = outputToTerminal;
        logConfigFile = "./logger.conf";   // 日志配置文件名称
    }